

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O0

Vec_Int_t * Abc_SclFindCriticalCoWindow(SC_Man *p,int Window)

{
  int iVar1;
  uint Entry;
  Vec_Int_t *p_00;
  Abc_Obj_t *pObj_00;
  float fVar2;
  float fVar3;
  int local_2c;
  int i;
  Abc_Obj_t *pObj;
  Vec_Int_t *vPivots;
  float fMaxArr;
  int Window_local;
  SC_Man *p_local;
  
  fVar2 = Abc_SclReadMaxDelay(p);
  p_00 = Vec_IntAlloc(100);
  for (local_2c = 0; iVar1 = Abc_NtkCoNum(p->pNtk), local_2c < iVar1; local_2c = local_2c + 1) {
    pObj_00 = Abc_NtkCo(p->pNtk,local_2c);
    fVar3 = Abc_SclObjTimeMax(p,pObj_00);
    if ((fVar2 * (100.0 - (float)Window)) / 100.0 <= fVar3) {
      Entry = Abc_ObjId(pObj_00);
      Vec_IntPush(p_00,Entry);
    }
  }
  iVar1 = Vec_IntSize(p_00);
  if (iVar1 < 1) {
    __assert_fail("Vec_IntSize(vPivots) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclUpsize.c"
                  ,0x6c,"Vec_Int_t *Abc_SclFindCriticalCoWindow(SC_Man *, int)");
  }
  return p_00;
}

Assistant:

Vec_Int_t * Abc_SclFindCriticalCoWindow( SC_Man * p, int Window )
{
    float fMaxArr = Abc_SclReadMaxDelay( p ) * (100.0 - Window) / 100.0;
    Vec_Int_t * vPivots;
    Abc_Obj_t * pObj;
    int i;
    vPivots = Vec_IntAlloc( 100 );
    Abc_NtkForEachCo( p->pNtk, pObj, i )
        if ( Abc_SclObjTimeMax(p, pObj) >= fMaxArr )
            Vec_IntPush( vPivots, Abc_ObjId(pObj) );
    assert( Vec_IntSize(vPivots) > 0 );
    return vPivots;
}